

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O2

void yaml_emitter_set_output_file(yaml_emitter_t *emitter,FILE *file)

{
  if (emitter == (yaml_emitter_t *)0x0) {
    __assert_fail("emitter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x1e0,"void yaml_emitter_set_output_file(yaml_emitter_t *, FILE *)");
  }
  if (emitter->write_handler == (yaml_write_handler_t *)0x0) {
    if (file != (FILE *)0x0) {
      emitter->write_handler = yaml_file_write_handler;
      emitter->write_handler_data = emitter;
      (emitter->output).file = file;
      return;
    }
    __assert_fail("file",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x1e2,"void yaml_emitter_set_output_file(yaml_emitter_t *, FILE *)");
  }
  __assert_fail("!emitter->write_handler",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                ,0x1e1,"void yaml_emitter_set_output_file(yaml_emitter_t *, FILE *)");
}

Assistant:

YAML_DECLARE(void)
yaml_emitter_set_output_file(yaml_emitter_t *emitter, FILE *file)
{
    assert(emitter);    /* Non-NULL emitter object expected. */
    assert(!emitter->write_handler);    /* You can set the output only once. */
    assert(file);       /* Non-NULL file object expected. */

    emitter->write_handler = yaml_file_write_handler;
    emitter->write_handler_data = emitter;

    emitter->output.file = file;
}